

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileSize.cpp
# Opt level: O3

int64_t __thiscall blc::tools::fileSize(tools *this,_Ios_Seekdir param_2)

{
  char cVar1;
  int64_t iVar2;
  
  cVar1 = std::__basic_file<char>::is_open();
  iVar2 = -1;
  if (cVar1 != '\0') {
    std::istream::seekg((long)this,_S_beg);
    iVar2 = std::istream::tellg();
    std::istream::seekg((long)this,param_2);
  }
  return iVar2;
}

Assistant:

int64_t blc::tools::fileSize(std::ifstream &file, std::streampos pos, std::ios_base::seekdir way) {
	if (file.is_open() == false)
		return (-1);
	file.seekg(0, file.end);
	int64_t len = file.tellg();
	file.seekg(pos, way);

	return (len);
}